

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatHexInt_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value)

{
  void *pvVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [380];
  int local_14;
  string *psStack_10;
  int value_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pvVar1 = (void *)std::ostream::operator<<(local_190,std::hex);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::uppercase);
  std::ostream::operator<<(pvVar1,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatHexInt(int value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}